

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O3

bool __thiscall tf::Executor::_wait_for_task(Executor *this,Worker *worker,Node **t)

{
  atomic<unsigned_long> *paVar1;
  Notifier *this_00;
  Notifier *pNVar2;
  uint64_t uVar3;
  size_t sVar4;
  ulong uVar5;
  __pointer_type pAVar6;
  atomic<long> aVar7;
  Waiter *pWVar8;
  Node *pNVar9;
  long lVar10;
  result_type rVar11;
  pointer pWVar12;
  __base_type _Var13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  uniform_int_distribution<unsigned_long> local_40;
  
  paVar1 = &this->_num_thieves;
  this_00 = &this->_notifier;
LAB_0012aad3:
  LOCK();
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  do {
    lVar10 = (long)(this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 7;
    local_40._M_param._M_b = lVar10 * -0x5555555555555555 - 1;
    local_40._M_param._M_a = 0;
    uVar15 = 0;
    uVar14 = 0;
    do {
      sVar4 = worker->_vtm;
      if (worker->_id == sVar4) {
        uVar5 = (this->_wsq)._top.super___atomic_base<long>._M_i;
        if ((this->_wsq)._bottom.super___atomic_base<long>._M_i <= (long)uVar5) goto LAB_0012abc5;
        pAVar6 = (this->_wsq)._array._M_b._M_p;
        _Var13._M_p = pAVar6->S[pAVar6->M & uVar5]._M_b._M_p;
        LOCK();
        bVar16 = uVar5 == (this->_wsq)._top.super___atomic_base<long>._M_i;
        if (bVar16) {
          (this->_wsq)._top.super___atomic_base<long>._M_i = uVar5 + 1;
        }
        UNLOCK();
        if (!bVar16) goto LAB_0012abc5;
LAB_0012abb8:
        *t = _Var13._M_p;
        if (_Var13._M_p != (Node *)0x0) goto LAB_0012ad27;
      }
      else {
        pWVar12 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        aVar7.super___atomic_base<long>._M_i = pWVar12[sVar4]._wsq._top.super___atomic_base<long>;
        if ((long)aVar7.super___atomic_base<long>._M_i <
            pWVar12[sVar4]._wsq._bottom.super___atomic_base<long>._M_i) {
          pAVar6 = pWVar12[sVar4]._wsq._array._M_b._M_p;
          _Var13._M_p = pAVar6->S[pAVar6->M & (ulong)aVar7.super___atomic_base<long>._M_i]._M_b._M_p
          ;
          LOCK();
          bVar16 = aVar7.super___atomic_base<long>._M_i ==
                   (__atomic_base<long>)pWVar12[sVar4]._wsq._top.super___atomic_base<long>._M_i;
          if (bVar16) {
            pWVar12[sVar4]._wsq._top.super___atomic_base<long>._M_i =
                 (aVar7.super___atomic_base<long>._M_i + 1)._M_i;
          }
          UNLOCK();
          if (bVar16) goto LAB_0012abb8;
        }
LAB_0012abc5:
        *t = (Node *)0x0;
      }
      if (lVar10 * 0x5555555555555556 + 2U < uVar14) {
        sched_yield();
        if (100 < uVar15) break;
        uVar15 = uVar15 + 1;
      }
      rVar11 = std::uniform_int_distribution<unsigned_long>::operator()
                         (&local_40,&worker->_rdgen,&local_40._M_param);
      worker->_vtm = rVar11;
      uVar14 = uVar14 + 1;
    } while (((this->_done)._M_base._M_i & 1U) == 0);
    if (*t != (Node *)0x0) {
LAB_0012ad27:
      LOCK();
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
      UNLOCK();
      if ((paVar1->super___atomic_base<unsigned_long>)._M_i != 0) {
        return true;
      }
      Notifier::notify(this_00,false);
      return true;
    }
    pWVar8 = worker->_waiter;
    LOCK();
    pNVar2 = &this->_notifier;
    uVar3 = (pNVar2->_state).super___atomic_base<unsigned_long>._M_i;
    (pNVar2->_state).super___atomic_base<unsigned_long>._M_i =
         (pNVar2->_state).super___atomic_base<unsigned_long>._M_i + 0x10000;
    UNLOCK();
    pWVar8->epoch = uVar3;
    if ((this->_wsq)._bottom.super___atomic_base<long>._M_i <=
        (this->_wsq)._top.super___atomic_base<long>._M_i) break;
    Notifier::cancel_wait(this_00,worker->_waiter);
    uVar14 = (this->_wsq)._top.super___atomic_base<long>._M_i;
    if ((long)uVar14 < (this->_wsq)._bottom.super___atomic_base<long>._M_i) {
      pAVar6 = (this->_wsq)._array._M_b._M_p;
      pNVar9 = pAVar6->S[pAVar6->M & uVar14]._M_b._M_p;
      LOCK();
      bVar16 = uVar14 == (this->_wsq)._top.super___atomic_base<long>._M_i;
      if (bVar16) {
        (this->_wsq)._top.super___atomic_base<long>._M_i = uVar14 + 1;
      }
      UNLOCK();
      if (!bVar16) goto LAB_0012ac9a;
      *t = pNVar9;
      if (pNVar9 != (Node *)0x0) goto LAB_0012ad27;
    }
    else {
LAB_0012ac9a:
      *t = (Node *)0x0;
    }
    worker->_vtm = worker->_id;
  } while( true );
  if (((this->_done)._M_base._M_i & 1U) != 0) {
    Notifier::cancel_wait(this_00,worker->_waiter);
    Notifier::notify(this_00,true);
    LOCK();
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    return false;
  }
  LOCK();
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_long>)._M_i != 0) {
LAB_0012ad51:
    Notifier::commit_wait(this_00,worker->_waiter);
    return true;
  }
  if ((this->_num_actives).super___atomic_base<unsigned_long>._M_i == 0) {
    pWVar12 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
              super__Vector_impl_data._M_start;
    while( true ) {
      if (pWVar12 ==
          (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0012ad51;
      if ((pWVar12->_wsq)._top.super___atomic_base<long>._M_i <
          (pWVar12->_wsq)._bottom.super___atomic_base<long>._M_i) break;
      pWVar12 = pWVar12 + 1;
    }
    worker->_vtm = pWVar12->_id;
  }
  Notifier::cancel_wait(this_00,worker->_waiter);
  goto LAB_0012aad3;
}

Assistant:

inline bool Executor::_wait_for_task(Worker& worker, Node*& t) {

  wait_for_task:

  //assert(!t);

  ++_num_thieves;

  explore_task:

  _explore_task(worker, t);

  if(t) {
    if(_num_thieves.fetch_sub(1) == 1) {
      _notifier.notify(false);
    }
    return true;
  }

  _notifier.prepare_wait(worker._waiter);

  //if(auto vtm = _find_vtm(me); vtm != _workers.size()) {
  if(!_wsq.empty()) {

    _notifier.cancel_wait(worker._waiter);
    //t = (vtm == me) ? _wsq.steal() : _workers[vtm].wsq.steal();

    t = _wsq.steal();  // must steal here
    if(t) {
      if(_num_thieves.fetch_sub(1) == 1) {
        _notifier.notify(false);
      }
      return true;
    }
    else {
      worker._vtm = worker._id;
      goto explore_task;
    }
  }

  if(_done) {
    _notifier.cancel_wait(worker._waiter);
    _notifier.notify(true);
    --_num_thieves;
    return false;
  }

  if(_num_thieves.fetch_sub(1) == 1) {
    if(_num_actives) {
      _notifier.cancel_wait(worker._waiter);
      goto wait_for_task;
    }
    // check all queues again
    for(auto& w : _workers) {
      if(!w._wsq.empty()) {
        worker._vtm = w._id;
        _notifier.cancel_wait(worker._waiter);
        goto wait_for_task;
      }
    }
  }

  // Now I really need to relinguish my self to others
  _notifier.commit_wait(worker._waiter);

  return true;
}